

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_EndOfData(VGMPlayer *this)

{
  UINT8 UVar1;
  DEV_INFO *pDVar2;
  reference pvVar3;
  bool bVar4;
  UINT8 retVal;
  DEV_INFO *devInf;
  size_t curDev;
  UINT8 doStop;
  VGMPlayer *this_local;
  
  if ((this->_fileHdr).loopOfs == 0) {
    this->_playState = this->_playState | 2;
    this->_psTrigger = this->_psTrigger | 2;
    if ((this->super_PlayerBase)._eventCbFunc != (PLAYER_EVENT_CB)0x0) {
      (*(this->super_PlayerBase)._eventCbFunc)
                (&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x04',(void *)0x0);
    }
    if ((this->_playOpts).hardStopOld != '\0') {
      bVar4 = false;
      if ((this->_fileHdr).fileVer == 0x150) {
        bVar4 = (this->_playOpts).hardStopOld == '\x02';
      }
      if ((this->_fileHdr).fileVer < 0x150 || bVar4) {
        for (devInf = (DEV_INFO *)0x0;
            pDVar2 = (DEV_INFO *)
                     std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::
                     size(&this->_devices), devInf < pDVar2;
            devInf = (DEV_INFO *)((long)&devInf->dataPtr + 1)) {
          pvVar3 = std::vector<VGMPlayer::CHIP_DEVICE,_std::allocator<VGMPlayer::CHIP_DEVICE>_>::
                   operator[](&this->_devices,(size_type)devInf);
          (*((pvVar3->base).defInf.devDef)->Reset)((pvVar3->base).defInf.dataPtr);
        }
      }
    }
  }
  else {
    this->_curLoop = this->_curLoop + 1;
    if (((this->super_PlayerBase)._eventCbFunc == (PLAYER_EVENT_CB)0x0) ||
       (UVar1 = (*(this->super_PlayerBase)._eventCbFunc)
                          (&this->super_PlayerBase,(this->super_PlayerBase)._eventCbParam,'\x03',
                           &this->_curLoop), UVar1 != '\x01')) {
      this->_filePos = (this->_fileHdr).loopOfs;
    }
    else {
      this->_playState = this->_playState | 2;
      this->_psTrigger = this->_psTrigger | 2;
    }
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_EndOfData(void)
{
	if (! _fileHdr.loopOfs)
	{
		_playState |= PLAYSTATE_END;
		_psTrigger |= PLAYSTATE_END;
		if (_eventCbFunc != NULL)
			_eventCbFunc(this, _eventCbParam, PLREVT_END, NULL);
		
		if (_playOpts.hardStopOld)
		{
			UINT8 doStop = 0x00;
			doStop |= (_fileHdr.fileVer < 0x150) << 0;
			doStop |= (_fileHdr.fileVer == 0x150 && _playOpts.hardStopOld == 2) << 1;
			if (doStop)
			{
				size_t curDev;
				for (curDev = 0; curDev < _devices.size(); curDev ++)
				{
					DEV_INFO* devInf = &_devices[curDev].base.defInf;
					devInf->devDef->Reset(devInf->dataPtr);
				}
			}
		}
	}
	else
	{
		_curLoop ++;
		if (_eventCbFunc != NULL)
		{
			UINT8 retVal;
			
			retVal = _eventCbFunc(this, _eventCbParam, PLREVT_LOOP, &_curLoop);
			if (retVal == 0x01)
			{
				_playState |= PLAYSTATE_END;
				_psTrigger |= PLAYSTATE_END;
				return;
			}
		}
		_filePos = _fileHdr.loopOfs;
	}
	
	return;
}